

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb__stb_idict_addset(stb_idict *a,stb_int32 k,stb_int32 v,int allow_new,int allow_old,int copy)

{
  uchar uVar1;
  stb__stb_idict__hashpair *psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar8;
  uint uVar9;
  ulong uVar7;
  
  if (k == 3) {
    uVar1 = a->has_del;
    if (uVar1 == '\0') {
      if (allow_new != 0) goto LAB_001857b8;
    }
    else if (allow_old != 0) {
LAB_001857b8:
      a->dv = v;
      a->has_del = '\x01';
      return (uint)(uVar1 == '\0');
    }
  }
  else if (k == 1) {
    uVar1 = a->has_empty;
    if (uVar1 == '\0') {
      if (allow_new != 0) goto LAB_001857a4;
    }
    else if (allow_old != 0) {
LAB_001857a4:
      a->ev = v;
      a->has_empty = '\x01';
      return (uint)(uVar1 == '\0');
    }
  }
  else {
    iVar4 = ((uint)k >> 0x13) + ((uint)k >> 6) + k;
    uVar5 = iVar4 * 0x80008 ^ iVar4 * 0x10001;
    uVar5 = (uVar5 >> 5) + uVar5;
    uVar5 = uVar5 * 4 ^ uVar5;
    uVar5 = (uVar5 >> 0xf) + uVar5;
    uVar5 = uVar5 * 0x400 ^ uVar5;
    uVar9 = (uVar5 >> 0x13) + (uVar5 >> 6) + uVar5;
    uVar5 = a->mask;
    uVar6 = uVar5 & uVar9;
    uVar7 = (ulong)uVar6;
    psVar2 = a->table;
    iVar4 = psVar2[uVar6].k;
    if (iVar4 == 1) {
      uVar8 = 0xffffffff;
    }
    else {
      uVar8 = uVar6;
      if ((iVar4 == 3) || (uVar8 = 0xffffffff, iVar4 != k)) {
        do {
          while( true ) {
            uVar6 = (int)uVar7 + ((uVar9 >> 0x13) + (uVar9 >> 6) + uVar9 | 1) & uVar5;
            uVar7 = (ulong)uVar6;
            iVar4 = psVar2[uVar7].k;
            if (iVar4 == 1) {
              bVar3 = true;
              goto LAB_001857e9;
            }
            if (iVar4 != 3) break;
            if ((int)uVar8 < 0) {
              uVar8 = uVar6;
            }
          }
        } while (iVar4 != k);
        if (allow_old != 0) {
          psVar2[uVar7].v = v;
        }
      }
      else if (allow_old != 0) {
        psVar2[uVar6].v = v;
      }
      uVar5 = (uint)(allow_new == 0);
      bVar3 = false;
LAB_001857e9:
      if (!bVar3) {
        return uVar5;
      }
    }
    if (allow_new != 0) {
      if (-1 < (int)uVar8) {
        a->deleted = a->deleted + -1;
        uVar6 = uVar8;
      }
      psVar2[(int)uVar6].k = k;
      psVar2[(int)uVar6].v = v;
      iVar4 = a->count;
      a->count = iVar4 + 1;
      if (iVar4 < a->grow_threshhold) {
        return 1;
      }
      stb__stb_idict_rehash(a,a->limit * 2);
      return 1;
    }
  }
  return 0;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}